

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandExtSeqDcs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  uint fVerbose;
  char *pcVar2;
  
  Abc_FrameReadNtk(pAbc);
  pNtk = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar2 = "Empty network.\n";
    }
    else {
      if (pNtk->nObjCounts[8] == 0) {
        pcVar2 = "The current network has no latches.\n";
LAB_0020cbb1:
        Abc_Print(-1,pcVar2);
        return 0;
      }
      if (pNtk->ntkType != ABC_NTK_STRASH) {
        pcVar2 = "Extracting sequential don\'t-cares works only for AIGs (run \"strash\").\n";
        goto LAB_0020cbb1;
      }
      iVar1 = Abc_NtkExtractSequentialDcs(pNtk,fVerbose);
      if (iVar1 != 0) {
        return 0;
      }
      pcVar2 = "Extracting sequential don\'t-cares has failed.\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: ext_seq_dcs [-vh]\n");
    Abc_Print(-2,"\t         create EXDC network using unreachable states\n");
    pcVar2 = "yes";
    if (fVerbose == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar2);
    pcVar2 = "\t-h     : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandExtSeqDcs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fVerbose;
    extern int Abc_NtkExtractSequentialDcs( Abc_Ntk_t * pNet, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "The current network has no latches.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Extracting sequential don't-cares works only for AIGs (run \"strash\").\n" );
        return 0;
    }
    if ( !Abc_NtkExtractSequentialDcs( pNtk, fVerbose ) )
    {
        Abc_Print( -1, "Extracting sequential don't-cares has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: ext_seq_dcs [-vh]\n" );
    Abc_Print( -2, "\t         create EXDC network using unreachable states\n" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}